

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execBitImEa<(moira::Instr)34,(moira::Mode)0,(moira::Size)1>(Moira *this,u16 opcode)

{
  u32 uVar1;
  
  uVar1 = readI<(moira::Size)1>(this);
  (this->reg).sr.z =
       (*(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) >> (uVar1 & 0x1f) & 1) == 0;
  prefetch<4ul>(this);
  (*this->_vptr_Moira[0x19])(this,2);
  return;
}

Assistant:

void
Moira::execBitImEa(u16 opcode)
{
    u8  src = readI<S>();
    int dst = _____________xxx(opcode);

    switch (M)
    {
        case 0:
        {
            src &= 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, src);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(src));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            src &= 0b111;
            u32 ea, data;
            if (!readOp<M,S>(dst, ea, data)) return;

            data = bit<I>(data, src);

            if (I != BTST) {
                prefetch();
                writeM <M, S, POLLIPL> (ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}